

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O1

string * __thiscall
diligent_spirv_cross::extract_string_abi_cxx11_
          (string *__return_storage_ptr__,diligent_spirv_cross *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,uint32_t offset)

{
  pointer pcVar1;
  uint uVar2;
  long lVar3;
  runtime_error *this_00;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar8 = (ulong)spirv & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = *(long *)this;
  uVar5 = *(long *)(this + 8) - lVar3 >> 2;
  bVar4 = ((ulong)spirv & 0xffffffff) < uVar5;
  if (((ulong)spirv & 0xffffffff) < uVar5) {
    bVar6 = false;
    do {
      uVar7 = *(uint *)(lVar3 + uVar8 * 4);
      bVar9 = false;
      uVar2 = 0;
      do {
        if ((char)uVar7 == '\0') {
          bVar6 = true;
          break;
        }
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar7 = uVar7 >> 8;
        bVar9 = 2 < uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 4);
      if (!bVar9) break;
      uVar8 = (ulong)((int)uVar8 + 1);
      lVar3 = *(long *)this;
      uVar5 = *(long *)(this + 8) - lVar3 >> 2;
      bVar4 = uVar8 < uVar5;
    } while (uVar8 < uVar5);
  }
  else {
    bVar6 = false;
  }
  if (bVar4) {
    if ((!bVar6) &&
       (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 != &__return_storage_ptr__->field_2)) {
      operator_delete(pcVar1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"String was not terminated before EOF");
  *(undefined ***)this_00 = &PTR__runtime_error_00b70ca0;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string extract_string(const vector<uint32_t> &spirv, uint32_t offset)
{
	string ret;
	for (uint32_t i = offset; i < spirv.size(); i++)
	{
		uint32_t w = spirv[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			char c = w & 0xff;
			if (c == '\0')
				return ret;
			ret += c;
		}
	}

	SPIRV_CROSS_THROW("String was not terminated before EOF");
}